

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
::_swap_at_index(RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                 *this,Index columnIndex)

{
  __node_base *p_Var1;
  Dimension DVar2;
  Field_operators *pFVar3;
  Entry_constructor *pEVar4;
  __buckets_ptr pp_Var5;
  ulong uVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  _Hash_node_base *p_Var9;
  ID_index rowIndex2;
  ulong uVar10;
  ID_index rowIndex2_00;
  ID_index rowIndex1;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  __hash_code __code;
  uint local_48;
  Index local_44;
  ulong local_40;
  ulong local_38;
  
  rowIndex2_00 = columnIndex + 1;
  p_Var1 = &this[1].super_type.idToPosition_._M_h._M_before_begin;
  local_48 = rowIndex2_00;
  local_44 = columnIndex;
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)p_Var1,&local_44);
  pmVar8 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)p_Var1,&local_48);
  DVar2 = (pmVar7->super_Column_dimension_option).dim_;
  (pmVar7->super_Column_dimension_option).dim_ = (pmVar8->super_Column_dimension_option).dim_;
  (pmVar8->super_Column_dimension_option).dim_ = DVar2;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&pmVar7->column_,(node_ptr)&pmVar8->column_);
  pFVar3 = pmVar7->operators_;
  pmVar7->operators_ = pmVar8->operators_;
  pmVar8->operators_ = pFVar3;
  pEVar4 = pmVar7->entryPool_;
  pmVar7->entryPool_ = pmVar8->entryPool_;
  pmVar8->entryPool_ = pEVar4;
  pp_Var5 = (this->super_type).super_type.map_._M_h._M_buckets;
  uVar6 = (this->super_type).super_type.map_._M_h._M_bucket_count;
  uVar10 = (ulong)columnIndex % uVar6;
  p_Var11 = pp_Var5[uVar10];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var11->_M_nxt, p_Var12 = p_Var11,
     *(Index *)&p_Var11->_M_nxt[1]._M_nxt != columnIndex)) {
    while (p_Var11 = p_Var9, p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar6 != uVar10) ||
         (p_Var12 = p_Var11, *(uint *)&p_Var9[1]._M_nxt == columnIndex)) goto LAB_001553fe;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_001553fe:
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var12->_M_nxt;
  }
  rowIndex1 = columnIndex;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    rowIndex1 = *(ID_index *)((long)&p_Var9[1]._M_nxt + 4);
  }
  local_40 = (ulong)rowIndex2_00;
  p_Var11 = pp_Var5[local_40 % uVar6];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var11->_M_nxt, p_Var12 = p_Var11,
     *(uint *)&p_Var11->_M_nxt[1]._M_nxt != rowIndex2_00)) {
    while (p_Var11 = p_Var9, p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar6 != local_40 % uVar6) ||
         (p_Var12 = p_Var11, *(uint *)&p_Var9[1]._M_nxt == rowIndex2_00)) goto LAB_00155469;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_00155469:
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var12->_M_nxt;
  }
  rowIndex2 = rowIndex2_00;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    rowIndex2 = *(ID_index *)((long)&p_Var9[1]._M_nxt + 4);
  }
  local_38 = (ulong)columnIndex;
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
  ::swap_rows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               *)&this[1].super_type.super_type.map_._M_h._M_rehash_policy,rowIndex1,rowIndex2);
  p_Var1 = &this[2].super_type.idToPosition_._M_h._M_before_begin;
  local_48 = rowIndex2_00;
  local_44 = columnIndex;
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)p_Var1,&local_44);
  pmVar8 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)p_Var1,&local_48);
  DVar2 = (pmVar7->super_Column_dimension_option).dim_;
  (pmVar7->super_Column_dimension_option).dim_ = (pmVar8->super_Column_dimension_option).dim_;
  (pmVar8->super_Column_dimension_option).dim_ = DVar2;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&pmVar7->column_,(node_ptr)&pmVar8->column_);
  pFVar3 = pmVar7->operators_;
  pmVar7->operators_ = pmVar8->operators_;
  pmVar8->operators_ = pFVar3;
  pEVar4 = pmVar7->entryPool_;
  pmVar7->entryPool_ = pmVar8->entryPool_;
  pmVar8->entryPool_ = pEVar4;
  pp_Var5 = (this->super_type).super_type.map_._M_h._M_buckets;
  uVar6 = (this->super_type).super_type.map_._M_h._M_bucket_count;
  p_Var11 = pp_Var5[local_38 % uVar6];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var11->_M_nxt, p_Var12 = p_Var11,
     *(Index *)&p_Var11->_M_nxt[1]._M_nxt != columnIndex)) {
    while (p_Var11 = p_Var9, p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar6 != local_38 % uVar6) ||
         (p_Var12 = p_Var11, *(uint *)&p_Var9[1]._M_nxt == columnIndex)) goto LAB_00155553;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_00155553:
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var12->_M_nxt;
  }
  if (p_Var9 != (_Hash_node_base *)0x0) {
    columnIndex = *(ID_index *)((long)&p_Var9[1]._M_nxt + 4);
  }
  p_Var11 = pp_Var5[local_40 % uVar6];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var11->_M_nxt, p_Var12 = p_Var11,
     *(uint *)&p_Var11->_M_nxt[1]._M_nxt != rowIndex2_00)) {
    while (p_Var11 = p_Var9, p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar6 != local_40 % uVar6) ||
         (p_Var12 = p_Var11, *(uint *)&p_Var9[1]._M_nxt == rowIndex2_00)) goto LAB_001555ba;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_001555ba:
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var12->_M_nxt;
  }
  if (p_Var9 != (_Hash_node_base *)0x0) {
    rowIndex2_00 = *(ID_index *)((long)&p_Var9[1]._M_nxt + 4);
  }
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
  ::swap_rows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               *)&this[2].super_type.super_type.map_._M_h._M_rehash_policy,columnIndex,rowIndex2_00)
  ;
  return;
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_swap_at_index(Index columnIndex)
{
  _matrix()->reducedMatrixR_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->reducedMatrixR_.swap_rows(_get_row_id_from_position(columnIndex),
                                       _get_row_id_from_position(columnIndex + 1));
  _matrix()->mirrorMatrixU_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->mirrorMatrixU_.swap_rows(_get_row_id_from_position(columnIndex),
                                      _get_row_id_from_position(columnIndex + 1));
}